

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O3

void __thiscall
gl4cts::DirectStateAccess::Textures::StorageMultisampleTest::
CreateInputTexture<signed_char,3,false,2u>(StorageMultisampleTest *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  GLuint in_R8D;
  long lVar3;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x6f8))(1,&this->m_to);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glGenTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xd25);
  (**(code **)(lVar3 + 0xb8))(0xde1,this->m_to);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBindTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xd28);
  InputTextureImage<2u>(this,0x8d8f,2,3,in_R8D,0x8d98,0x1400,"");
  (**(code **)(lVar3 + 0x1360))(0xde1,0x2800,0x2600);
  (**(code **)(lVar3 + 0x1360))(0xde1,0x2801,0x2600);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glTexParameteri call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xd31);
  return;
}

Assistant:

void StorageMultisampleTest::CreateInputTexture()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Objects creation. */
	gl.genTextures(1, &m_to);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

	gl.bindTexture(InputTextureTarget<D>(), m_to);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

	/* Data setup. */
	InputTextureImage<D>(InternalFormat<T, S, N>(), TestReferenceDataWidth<D>(), TestReferenceDataHeight<D>(),
						 TestReferenceDataDepth<D>(), Format<S, N>(), Type<T>(), ReferenceData<T, N>());

	/* Parameter setup. */
	gl.texParameteri(InputTextureTarget<D>(), GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	gl.texParameteri(InputTextureTarget<D>(), GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri call failed.");
}